

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O3

void __thiscall gl4cts::BufferStorage::Program::Program(Program *this,Context *context)

{
  this->m_id = 0;
  (this->m_compute).m_id = 0;
  (this->m_compute).m_context = context;
  (this->m_fragment).m_id = 0;
  (this->m_fragment).m_context = context;
  (this->m_geometry).m_id = 0;
  (this->m_geometry).m_context = context;
  (this->m_tess_ctrl).m_id = 0;
  (this->m_tess_ctrl).m_context = context;
  (this->m_tess_eval).m_id = 0;
  (this->m_tess_eval).m_context = context;
  (this->m_vertex).m_id = 0;
  (this->m_vertex).m_context = context;
  this->m_context = context;
  return;
}

Assistant:

Program::Program(deqp::Context& context)
	: m_id(m_invalid_id)
	, m_compute(context)
	, m_fragment(context)
	, m_geometry(context)
	, m_tess_ctrl(context)
	, m_tess_eval(context)
	, m_vertex(context)
	, m_context(context)
{
	/* Nothing to be done here */
}